

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::H1V1Convert(jpeg_decoder *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint8 *puVar6;
  uint8 *puVar7;
  int iVar8;
  int j;
  long lVar9;
  int iVar10;
  
  if (0 < this->m_max_mcus_per_row) {
    puVar6 = this->m_pSample_buf + ((long)this->m_max_mcu_y_size - (long)this->m_mcu_lines_left) * 8
    ;
    puVar7 = this->m_pScan_line_0;
    iVar5 = this->m_max_mcus_per_row;
    do {
      lVar9 = 0;
      do {
        bVar1 = puVar6[lVar9];
        bVar2 = puVar6[lVar9 + 0x80];
        iVar8 = this->m_crr[bVar2] + (uint)bVar1;
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        if (0xfe < iVar8) {
          iVar8 = 0xff;
        }
        bVar3 = puVar6[lVar9 + 0x40];
        *puVar7 = (uint8)iVar8;
        iVar8 = (this->m_cbg[bVar3] + this->m_crg[bVar2] >> 0x10) + (uint)bVar1;
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        if (0xfe < iVar8) {
          iVar8 = 0xff;
        }
        puVar7[1] = (uint8)iVar8;
        iVar10 = (uint)bVar1 + this->m_cbb[bVar3];
        iVar8 = 0;
        if (0 < iVar10) {
          iVar8 = iVar10;
        }
        if (0xfe < iVar8) {
          iVar8 = 0xff;
        }
        puVar7[2] = (uint8)iVar8;
        puVar7[3] = 0xff;
        puVar7 = puVar7 + 4;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      puVar6 = puVar6 + 0xc0;
      bVar4 = 1 < iVar5;
      iVar5 = iVar5 + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

void jpeg_decoder::H1V1Convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d = m_pScan_line_0;
		uint8* s = m_pSample_buf + row * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			for (int j = 0; j < 8; j++)
			{
				int y = s[j];
				int cb = s[64 + j];
				int cr = s[128 + j];

				d[0] = clamp(y + m_crr[cr]);
				d[1] = clamp(y + ((m_crg[cr] + m_cbg[cb]) >> 16));
				d[2] = clamp(y + m_cbb[cb]);
				d[3] = 255;

				d += 4;
			}

			s += 64 * 3;
		}
	}